

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_connection::connect_failed(peer_connection *this,error_code *e)

{
  undefined1 *puVar1;
  session_interface *psVar2;
  torrent_peer *ptVar3;
  io_context *piVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  long *plVar8;
  undefined4 extraout_var_00;
  bt_peer_connection *this_00;
  undefined4 extraout_var_01;
  endpoint *ep;
  error_code *ec;
  endpoint *ep_00;
  undefined8 uVar9;
  string local_a8;
  shared_ptr<libtorrent::aux::torrent> t;
  weak_ptr<libtorrent::aux::torrent> weak_t;
  string local_60;
  weak_ptr<libtorrent::aux::peer_connection> weak_self;
  char local_28 [4];
  uint local_24;
  
  iVar7 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
            _vptr_session_logger[5])();
  if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar7) + 0x68) < 0) {
    print_endpoint_abi_cxx11_(&local_a8,(aux *)&this->m_remote,ep);
    _Var5._M_p = local_a8._M_dataplus._M_p;
    print_error_abi_cxx11_(&local_60,(libtorrent *)e,ec);
    peer_log(this,info,"CONNECTION FAILED","%s %s",_Var5._M_p,local_60._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_a8);
  }
  iVar7 = (**(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
             _vptr_session_logger)();
  if ((char)iVar7 != '\0') {
    psVar2 = (this->super_peer_connection_hot_members).m_ses;
    print_endpoint_abi_cxx11_(&local_a8,(aux *)&this->m_remote,ep_00);
    (*(psVar2->super_session_logger)._vptr_session_logger[1])
              (psVar2,"CONNECTION FAILED: %s",local_a8._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_a8);
  }
  counters::inc_stats_counter(this->m_counters,0x2b,1);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_peer_connection_hot_members).m_torrent);
  if (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
    counters::inc_stats_counter(this->m_counters,0xe5,-1);
    if ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) && (this->m_peer_info != (torrent_peer *)0x0)) {
      torrent::dec_num_connecting
                (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 this->m_peer_info);
    }
    puVar1 = &(this->super_peer_connection_hot_members).field_0x28;
    *puVar1 = *puVar1 & 0xfd;
  }
  bVar6 = is_utp(&this->m_socket);
  if ((((bVar6) && (ptVar3 = this->m_peer_info, ptVar3 != (torrent_peer *)0x0)) &&
      ((*(uint *)&ptVar3->field_0x1b >> 0x1c & 1) != 0)) && ((this->field_0x886 & 0x40) == 0)) {
    *(uint *)&ptVar3->field_0x1b = *(uint *)&ptVar3->field_0x1b & 0xefffffff;
    fast_reconnect(this,true);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,e,0x10,0);
    if ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) && (this->m_peer_info != (torrent_peer *)0x0)) {
      ::std::__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
      __weak_ptr<libtorrent::aux::torrent,void>
                ((__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&weak_t,
                 &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
      ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::peer_connection,void>
                ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8,
                 (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
      ::std::__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
      __weak_ptr<libtorrent::aux::peer_connection,void>
                ((__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                 &weak_self.
                  super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
      piVar4 = this->m_ios;
      ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&local_a8,
                 &weak_t.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
      ::std::__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                ((__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8.field_2,
                 &weak_self.
                  super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>);
      local_60._M_dataplus._M_p = local_28;
      local_24 = 1;
      plVar8 = (long *)__tls_get_addr(&PTR_004d3f18);
      if (*plVar8 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(undefined8 *)(*plVar8 + 8);
      }
      local_60._M_string_length =
           (size_type)
           boost::asio::detail::thread_info_base::
           allocate<boost::asio::detail::thread_info_base::default_tag>(uVar9,0x40);
      ((operation *)local_60._M_string_length)->next_ = (scheduler_operation *)0x0;
      ((operation *)local_60._M_string_length)->func_ =
           boost::asio::detail::
           executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:4194:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      ((operation *)local_60._M_string_length)->task_result_ = 0;
      ((operation *)(local_60._M_string_length + 0x18))->next_ =
           (scheduler_operation *)local_a8._M_dataplus._M_p;
      ((operation *)(local_60._M_string_length + 0x18))->func_ =
           (func_type)local_a8._M_string_length;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      *(size_type *)&((operation *)(local_60._M_string_length + 0x18))->task_result_ =
           local_a8.field_2._M_allocated_capacity;
      ((operation *)(local_60._M_string_length + 0x30))->next_ =
           (scheduler_operation *)local_a8.field_2._8_8_;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8.field_2._8_8_ = (scheduler_operation *)0x0;
      local_60.field_2._M_allocated_capacity = local_60._M_string_length;
      boost::asio::detail::scheduler::post_immediate_completion
                (piVar4->impl_,(operation *)local_60._M_string_length,SUB41((local_24 & 2) >> 1,0));
      local_60._M_string_length = 0;
      local_60.field_2._M_allocated_capacity = 0;
      boost::asio::detail::
      executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:4194:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
      ::ptr::reset((ptr *)&local_60);
      connect_failed(boost::system::error_code_const&)::$_0::~__0((__0 *)&local_a8);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                (&weak_self.
                  super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                (&weak_t.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    goto LAB_00227db6;
  }
  if ((this->field_0x886 & 0x40) != 0) {
    fast_reconnect(this,true);
  }
  bVar6 = is_utp(&this->m_socket);
  if (bVar6) {
    bVar6 = session_settings::get_bool((this->super_peer_connection_hot_members).m_settings,0x8022);
    if (!bVar6) goto LAB_00227d47;
  }
  else {
LAB_00227d47:
    if (((this->m_peer_info != (torrent_peer *)0x0) && ((this->m_peer_info->field_0x1e & 0x40) != 0)
        ) && ((this->field_0x886 & 0x40) == 0)) {
      iVar7 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(this);
      this_00 = torrent::find_introducer
                          (t.
                           super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(endpoint *)CONCAT44(extraout_var_00,iVar7));
      if (this_00 != (bt_peer_connection *)0x0) {
        iVar7 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(this);
        bt_peer_connection::write_holepunch_msg
                  (this_00,rendezvous,(endpoint *)CONCAT44(extraout_var_01,iVar7),no_error);
      }
    }
  }
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,e,0x10,1);
LAB_00227db6:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void peer_connection::connect_failed(error_code const& e)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(e);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::info))
		{
			peer_log(peer_log_alert::info, "CONNECTION FAILED"
				, "%s %s", print_endpoint(m_remote).c_str(), print_error(e).c_str());
		}
#endif
#ifndef TORRENT_DISABLE_LOGGING
		if (m_ses.should_log())
			m_ses.session_log("CONNECTION FAILED: %s", print_endpoint(m_remote).c_str());
#endif

		m_counters.inc_stats_counter(counters::connect_timeouts);

		auto t = m_torrent.lock();
		TORRENT_ASSERT(!m_connecting || t);
		if (m_connecting)
		{
			m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
			if (t && m_peer_info) t->dec_num_connecting(m_peer_info);
			m_connecting = false;
		}

		// a connection attempt using uTP just failed
		// mark this peer as not supporting uTP
		// we'll never try it again (unless we're trying holepunch)
		if (is_utp(m_socket)
			&& m_peer_info
			&& m_peer_info->supports_utp
			&& !m_holepunch_mode)
		{
			m_peer_info->supports_utp = false;
			// reconnect immediately using TCP
			fast_reconnect(true);
			disconnect(e, operation_t::connect, normal);
			if (t && m_peer_info)
			{
				std::weak_ptr<aux::torrent> weak_t = t;
				std::weak_ptr<peer_connection> weak_self = shared_from_this();

				// we can't touch m_connections here, since we're likely looping
				// over it. So defer the actual reconnection to after we've handled
				// the existing message queue
				post(m_ios, [weak_t, weak_self]()
				{
					auto tor = weak_t.lock();
					std::shared_ptr<peer_connection> p = weak_self.lock();
					if (tor && p)
					{
						aux::torrent_peer* pi = p->peer_info_struct();
						tor->connect_to_peer(pi, true);
					}
				});
			}
			return;
		}

		if (m_holepunch_mode)
			fast_reconnect(true);

#ifndef TORRENT_DISABLE_EXTENSIONS
		if ((!is_utp(m_socket)
				|| !m_settings.get_bool(settings_pack::enable_outgoing_tcp))
			&& m_peer_info
			&& m_peer_info->supports_holepunch
			&& !m_holepunch_mode)
		{
			// see if we can try a holepunch
			aux::bt_peer_connection* p = t->find_introducer(remote());
			if (p)
				p->write_holepunch_msg(aux::bt_peer_connection::hp_message::rendezvous, remote());
		}
#endif

		disconnect(e, operation_t::connect, failure);
	}